

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFont::RenderChar(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,ImWchar c)

{
  ushort uVar1;
  undefined6 in_register_0000000a;
  ImFontGlyph *pIVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  
  if ((0x20 < (uint)CONCAT62(in_register_0000000a,c)) ||
     ((0x100002600U >> ((ulong)c & 0x3f) & 1) == 0)) {
    if (((int)(uint)c < (this->IndexLookup).Size) &&
       (uVar1 = (this->IndexLookup).Data[c], uVar1 != 0xffff)) {
      pIVar2 = (ImFontGlyph *)
               ((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar1 * 0x28));
    }
    else {
      pIVar2 = this->FallbackGlyph;
    }
    if (pIVar2 != (ImFontGlyph *)0x0) {
      fVar3 = (float)(-(uint)(size < 0.0) & 0x3f800000 |
                     ~-(uint)(size < 0.0) & (uint)(size / this->FontSize));
      fVar4 = (float)(int)pos.x + (this->DisplayOffset).x;
      fVar5 = (float)(int)pos.y + (this->DisplayOffset).y;
      ImDrawList::PrimReserve(draw_list,6,4);
      local_20.x = pIVar2->X0 * fVar3 + fVar4;
      local_20.y = pIVar2->Y0 * fVar3 + fVar5;
      local_28.x = pIVar2->X1 * fVar3 + fVar4;
      local_28.y = fVar3 * pIVar2->Y1 + fVar5;
      local_30.x = pIVar2->U0;
      local_30.y = pIVar2->V0;
      local_38.x = pIVar2->U1;
      local_38.y = pIVar2->V1;
      ImDrawList::PrimRectUV(draw_list,&local_20,&local_28,&local_30,&local_38,col);
    }
  }
  return;
}

Assistant:

void ImFont::RenderChar(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, ImWchar c) const
{
    if (c == ' ' || c == '\t' || c == '\n' || c == '\r') // Match behavior of RenderText(), those 4 codepoints are hard-coded.
        return;
    if (const ImFontGlyph* glyph = FindGlyph(c))
    {
        float scale = (size >= 0.0f) ? (size / FontSize) : 1.0f;
        pos.x = (float)(int)pos.x + DisplayOffset.x;
        pos.y = (float)(int)pos.y + DisplayOffset.y;
        draw_list->PrimReserve(6, 4);
        draw_list->PrimRectUV(ImVec2(pos.x + glyph->X0 * scale, pos.y + glyph->Y0 * scale), ImVec2(pos.x + glyph->X1 * scale, pos.y + glyph->Y1 * scale), ImVec2(glyph->U0, glyph->V0), ImVec2(glyph->U1, glyph->V1), col);
    }
}